

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O0

float ncnn::activation_ss(float v,int activation_type,Mat *activation_params)

{
  long *in_RSI;
  int in_EDI;
  float in_XMM0_Da;
  float fVar1;
  float max;
  float min;
  float slope;
  undefined4 local_50;
  undefined4 local_34;
  
  if (in_EDI == 1) {
    local_34 = in_XMM0_Da;
    if (in_XMM0_Da <= 0.0) {
      local_34 = 0.0;
    }
  }
  else if (in_EDI == 2) {
    local_50 = in_XMM0_Da;
    if (in_XMM0_Da <= 0.0) {
      local_50 = in_XMM0_Da * *(float *)*in_RSI;
    }
    local_34 = local_50;
  }
  else if (in_EDI == 3) {
    local_34 = in_XMM0_Da;
    if (in_XMM0_Da < *(float *)*in_RSI) {
      local_34 = *(float *)*in_RSI;
    }
    if (*(float *)(*in_RSI + 4) < local_34) {
      local_34 = *(float *)(*in_RSI + 4);
    }
  }
  else if (in_EDI == 4) {
    fVar1 = expf(-in_XMM0_Da);
    local_34 = 1.0 / (fVar1 + 1.0);
  }
  else {
    local_34 = in_XMM0_Da;
    if (in_EDI == 5) {
      fVar1 = expf(in_XMM0_Da);
      fVar1 = logf(fVar1 + 1.0);
      fVar1 = tanhf(fVar1);
      local_34 = in_XMM0_Da * fVar1;
    }
  }
  return local_34;
}

Assistant:

static inline float activation_ss(float v, int activation_type, const ncnn::Mat& activation_params)
{
    if (activation_type == 1)
    {
        v = fmaxf(v, 0.f);
    }
    else if (activation_type == 2)
    {
        float slope = activation_params[0];
        v = v > 0.f ? v : v * slope;
    }
    else if (activation_type == 3)
    {
        float min = activation_params[0];
        float max = activation_params[1];
        if (v < min)
            v = min;
        if (v > max)
            v = max;
    }
    else if (activation_type == 4)
    {
        v = 1.f / (1.f + expf(-v));
    }
    else if (activation_type == 5)
    {
        v = v * tanhf(logf(expf(v) + 1.f));
    }

    return v;
}